

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ImageFeatureType_EnumeratedImageSizes::SerializeWithCachedSizes
          (ImageFeatureType_EnumeratedImageSizes *this,CodedOutputStream *output)

{
  uint uVar1;
  ImageFeatureType_ImageSize *value;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ImageFeatureType_EnumeratedImageSizes *this_local;
  
  local_20 = 0;
  uVar1 = sizes_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = sizes(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void ImageFeatureType_EnumeratedImageSizes::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ImageFeatureType.EnumeratedImageSizes)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ImageFeatureType.ImageSize sizes = 1;
  for (unsigned int i = 0, n = this->sizes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->sizes(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ImageFeatureType.EnumeratedImageSizes)
}